

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_minelements(lysp_yang_ctx *ctx,uint32_t *min,uint16_t *flags,lysp_ext_instance **exts)

{
  ulong uVar1;
  LY_ERR LVar2;
  ushort **ppuVar3;
  int *piVar4;
  ulonglong uVar5;
  char *pcVar6;
  char *format;
  ly_ctx *plVar7;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  char *ptr;
  ly_stmt local_54;
  char *local_50;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  local_40 = (char *)0x0;
  if ((*flags >> 9 & 1) != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","min-elements");
    return LY_EVALID;
  }
  *flags = *flags | 0x200;
  LVar2 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&local_50,&local_40,&local_48);
  uVar1 = local_48;
  if (LVar2 != LY_SUCCESS) goto LAB_00173efb;
  if (local_48 == 0) {
LAB_00173e89:
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Invalid value \"%.*s\" of \"%s\".";
    pcVar6 = local_50;
LAB_00173eef:
    ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,uVar1 & 0xffffffff,pcVar6,"min-elements");
  }
  else {
    ppuVar3 = __ctype_b_loc();
    pcVar6 = local_50;
    if (((*(byte *)((long)*ppuVar3 + (long)*local_50 * 2 + 1) & 8) == 0) ||
       (uVar1 != 1 && *local_50 == '0')) goto LAB_00173e89;
    piVar4 = __errno_location();
    *piVar4 = 0;
    uVar5 = strtoull(pcVar6,&local_38,10);
    if ((long)local_38 - (long)pcVar6 != uVar1) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Invalid value \"%.*s\" of \"%s\".";
      goto LAB_00173eef;
    }
    if (uVar5 >> 0x20 != 0 || *piVar4 == 0x22) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Value \"%.*s\" is out of \"%s\" bounds.";
      goto LAB_00173eef;
    }
    *min = (uint32_t)uVar5;
    LVar2 = get_keyword(ctx,&local_54,&local_50,&local_48);
    if ((LVar2 != LY_SUCCESS) || (LVar2 = LY_SUCCESS, local_54 == LY_STMT_SYNTAX_SEMICOLON))
    goto LAB_00173efb;
    if (local_54 == LY_STMT_SYNTAX_LEFT_BRACE) {
      LVar2 = get_keyword(ctx,&local_54,&local_50,&local_48);
      if ((LVar2 == LY_SUCCESS) && (LVar2 = LY_SUCCESS, local_54 != LY_STMT_SYNTAX_RIGHT_BRACE)) {
        do {
          if (local_54 != LY_STMT_EXTENSION_INSTANCE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar7 = (ly_ctx *)0x0;
            }
            else {
              plVar7 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar6 = lyplg_ext_stmt2str(local_54);
            ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar6,"min-elements");
            goto LAB_00173ef6;
          }
          LVar2 = parse_ext(ctx,local_50,local_48,min,LY_STMT_MIN_ELEMENTS,0,exts);
        } while (((LVar2 == LY_SUCCESS) &&
                 (LVar2 = get_keyword(ctx,&local_54,&local_50,&local_48), LVar2 == LY_SUCCESS)) &&
                (LVar2 = LY_SUCCESS, local_54 != LY_STMT_SYNTAX_RIGHT_BRACE));
      }
      goto LAB_00173efb;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar6 = lyplg_ext_stmt2str(local_54);
    ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\".",
            pcVar6);
  }
LAB_00173ef6:
  LVar2 = LY_EVALID;
LAB_00173efb:
  free(local_40);
  return LVar2;
}

Assistant:

LY_ERR
parse_minelements(struct lysp_yang_ctx *ctx, uint32_t *min, uint16_t *flags, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word, *ptr;
    size_t word_len;
    unsigned long long num;
    enum ly_stmt kw;

    if (*flags & LYS_SET_MIN) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "min-elements");
        return LY_EVALID;
    }
    *flags |= LYS_SET_MIN;

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);

    if (!word_len || !isdigit(word[0]) || ((word[0] == '0') && (word_len > 1))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "min-elements");
        ret = LY_EVALID;
        goto cleanup;
    }

    errno = 0;
    num = strtoull(word, &ptr, LY_BASE_DEC);
    /* we have not parsed the whole argument */
    if ((size_t)(ptr - word) != word_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "min-elements");
        ret = LY_EVALID;
        goto cleanup;
    }
    if ((errno == ERANGE) || (num > UINT32_MAX)) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, (int)word_len, word, "min-elements");
        ret = LY_EVALID;
        goto cleanup;
    }
    *min = num;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, min, LY_STMT_MIN_ELEMENTS, 0, exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "min-elements");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}